

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# key-unicode.c
# Opt level: O0

uint32_t wpe_unicode_to_key_code(uint32_t wc)

{
  int iVar1;
  int local_18;
  int mid;
  int max;
  int min;
  uint32_t wc_local;
  
  mid = 0;
  local_18 = 0x2f3;
  min = wc;
  if (((wc < 0x20) || (0x7e < wc)) && ((wc < 0xa0 || (0xff < wc)))) {
    while (mid <= local_18) {
      iVar1 = (mid + local_18) / 2;
      if (unicode_to_keysym_table[iVar1].ucs < wc) {
        mid = iVar1 + 1;
      }
      else {
        if (unicode_to_keysym_table[iVar1].ucs <= wc) {
          return (uint)unicode_to_keysym_table[iVar1].keysym;
        }
        local_18 = iVar1 + -1;
      }
    }
    min = wc | 0x1000000;
  }
  return min;
}

Assistant:

uint32_t
wpe_unicode_to_key_code (uint32_t wc)
{
    int min = 0;
    int max = sizeof(unicode_to_keysym_table) / sizeof(unicode_to_keysym_table[0]) - 1;
    int mid;

    /* First check for Latin-1 characters (1:1 mapping) */
    if ((wc >= 0x0020 && wc <= 0x007e) || (wc >= 0x00a0 && wc <= 0x00ff))
        return wc;

    /* Binary search in table */
    while (max >= min) {
        mid = (min + max) / 2;
        if (unicode_to_keysym_table[mid].ucs < wc)
            min = mid + 1;
        else if (unicode_to_keysym_table[mid].ucs > wc)
            max = mid - 1;
        else /* found it */
            return unicode_to_keysym_table[mid].keysym;
    }

    /*
     * No matching keysym value found, return Unicode value plus 0x01000000
     * (a convention introduced in the UTF-8 work on xterm).
     */
    return wc | 0x01000000;
}